

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanTests.cpp
# Opt level: O2

int testSpanTestsSlicingUnboundedEdge(void)

{
  reference piVar1;
  ostream *poVar2;
  int iVar3;
  char *pcVar4;
  initializer_list<int> __l;
  Span<int,_18446744073709551615UL> sub;
  Span<int,_18446744073709551615UL> span;
  vector<int,_std::allocator<int>_> values;
  
  span.m_ptr = (pointer)0x200000001;
  span.m_size.m_size = 0x400000003;
  __l._M_len = 4;
  __l._M_array = (iterator)&span;
  std::vector<int,_std::allocator<int>_>::vector(&values,__l,(allocator_type *)&sub);
  span.m_ptr = (pointer)0x0;
  if ((long)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 0) {
    span.m_ptr = values.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
  }
  span.m_size.m_size =
       (long)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start >> 2;
  sub = MILBlob::Util::Span<int,_18446744073709551615UL>::Slice(&span,3);
  if (sub.m_size.m_size.m_size == 1) {
    iVar3 = 0;
    piVar1 = MILBlob::Util::Span<int,_18446744073709551615UL>::operator[](&sub,0);
    if (*piVar1 == 4) goto LAB_001767a9;
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x1e3);
    poVar2 = std::operator<<(poVar2,": error: ");
    pcVar4 = "(sub[0]) == (4)";
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x1e2);
    poVar2 = std::operator<<(poVar2,": error: ");
    pcVar4 = "(sub.Size()) == (size_t(1))";
  }
  poVar2 = std::operator<<(poVar2,pcVar4);
  poVar2 = std::operator<<(poVar2," was false, expected true.");
  std::endl<char,std::char_traits<char>>(poVar2);
  iVar3 = 1;
LAB_001767a9:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&values.super__Vector_base<int,_std::allocator<int>_>);
  return iVar3;
}

Assistant:

int testSpanTestsSlicingUnboundedEdge()
{
    std::vector<int> values = {1, 2, 3, 4};
    auto span = MakeSpan(values);

    auto sub = span.Slice(3);
    ML_ASSERT_EQ(sub.Size(), size_t(1));
    ML_ASSERT_EQ(sub[0], 4);

    return 0;
}